

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkDfsIterNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *p;
  void *pvVar2;
  int i;
  
  Abc_NtkIncrementTravId(pNtk);
  vNodes = Vec_PtrAlloc(1000);
  p = Vec_PtrAlloc(1000);
  for (i = 0; i < vRoots->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(vRoots,i);
    iVar1 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe));
    if (iVar1 == 0) {
      Abc_NtkDfs_iter(p,(Abc_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe),vNodes);
    }
  }
  Vec_PtrFree(p);
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsIterNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots )
{
    Vec_Ptr_t * vNodes, * vStack;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 1000 );
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pObj)) )
            Abc_NtkDfs_iter( vStack, Abc_ObjRegular(pObj), vNodes );
    Vec_PtrFree( vStack );
    return vNodes;
}